

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_view_test.cpp
# Opt level: O0

void test_detached_view<cornelich::util::buffer_view_const>(buffer_view *view)

{
  bool bVar1;
  ResultBuilder *pRVar2;
  ExpressionLhs<const_unsigned_char_*const_&> EVar3;
  ExpressionLhs<const_int_&> EVar4;
  int local_ba8;
  int32_t local_ba4;
  ExpressionLhs<const_int_&> local_ba0;
  SourceLineInfo local_b90;
  undefined1 local_b68 [8];
  ResultBuilder __catchResult_3;
  ExpressionLhs<const_int_&> local_8c0;
  SourceLineInfo local_8b0;
  undefined1 local_888 [8];
  ResultBuilder __catchResult_2;
  ExpressionLhs<const_int_&> local_5e0;
  SourceLineInfo local_5d0;
  undefined1 local_5a8 [8];
  ResultBuilder __catchResult_1;
  uint8_t *local_300;
  ExpressionLhs<const_unsigned_char_*const_&> local_2f8 [2];
  SourceLineInfo local_2d8;
  undefined1 local_2b0 [8];
  ResultBuilder __catchResult;
  buffer_view *view_local;
  
  __catchResult._664_8_ = view;
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/buffer_view_test.cpp"
               ,0x1f);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_2b0,"REQUIRE",&local_2d8,"view.data() == nullptr",Normal);
    Catch::SourceLineInfo::~SourceLineInfo(&local_2d8);
    local_300 = cornelich::util::buffer_view::data((buffer_view *)__catchResult._664_8_);
    EVar3 = Catch::ResultBuilder::operator->*((ResultBuilder *)local_2b0,&local_300);
    __catchResult_1.m_shouldDebugBreak = false;
    __catchResult_1.m_shouldThrow = false;
    __catchResult_1._666_6_ = 0;
    local_2f8[0] = EVar3;
    pRVar2 = Catch::ExpressionLhs<unsigned_char_const*const&>::operator==
                       ((ExpressionLhs<unsigned_char_const*const&> *)local_2f8,
                        (void **)&__catchResult_1.m_shouldDebugBreak);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_2b0);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_2b0);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2b0);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_5d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/buffer_view_test.cpp"
               ,0x20);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_5a8,"REQUIRE",&local_5d0,"view.limit() == 0",Normal);
    Catch::SourceLineInfo::~SourceLineInfo(&local_5d0);
    __catchResult_2._668_4_ =
         cornelich::util::buffer_view::limit((buffer_view *)__catchResult._664_8_);
    EVar4 = Catch::ResultBuilder::operator->*
                      ((ResultBuilder *)local_5a8,(int *)&__catchResult_2.field_0x29c);
    __catchResult_2.m_shouldDebugBreak = false;
    __catchResult_2.m_shouldThrow = false;
    __catchResult_2._666_2_ = 0;
    local_5e0 = EVar4;
    pRVar2 = Catch::ExpressionLhs<int_const&>::operator==
                       ((ExpressionLhs<int_const&> *)&local_5e0,
                        (int *)&__catchResult_2.m_shouldDebugBreak);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_5a8);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_5a8);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_5a8);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_8b0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/buffer_view_test.cpp"
               ,0x21);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_888,"REQUIRE",&local_8b0,"view.position() == 0",Normal);
    Catch::SourceLineInfo::~SourceLineInfo(&local_8b0);
    __catchResult_3._668_4_ =
         cornelich::util::buffer_view::position((buffer_view *)__catchResult._664_8_);
    EVar4 = Catch::ResultBuilder::operator->*
                      ((ResultBuilder *)local_888,(int *)&__catchResult_3.field_0x29c);
    __catchResult_3.m_shouldDebugBreak = false;
    __catchResult_3.m_shouldThrow = false;
    __catchResult_3._666_2_ = 0;
    local_8c0 = EVar4;
    pRVar2 = Catch::ExpressionLhs<int_const&>::operator==
                       ((ExpressionLhs<int_const&> *)&local_8c0,
                        (int *)&__catchResult_3.m_shouldDebugBreak);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_888);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_888);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_888);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_b90,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich_test/buffer_view_test.cpp"
               ,0x22);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_b68,"REQUIRE",&local_b90,"view.remaining() == 0",Normal);
    Catch::SourceLineInfo::~SourceLineInfo(&local_b90);
    local_ba4 = cornelich::util::buffer_view::remaining((buffer_view *)__catchResult._664_8_);
    EVar4 = Catch::ResultBuilder::operator->*((ResultBuilder *)local_b68,&local_ba4);
    local_ba8 = 0;
    local_ba0 = EVar4;
    pRVar2 = Catch::ExpressionLhs<int_const&>::operator==
                       ((ExpressionLhs<int_const&> *)&local_ba0,&local_ba8);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_b68);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_b68);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_b68);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  return;
}

Assistant:

void test_detached_view(T & view)
{
    REQUIRE(view.data() == nullptr);
    REQUIRE(view.limit() == 0);
    REQUIRE(view.position() == 0);
    REQUIRE(view.remaining() == 0);
}